

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

void invert_L8(uchar *L,int n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uchar tmp_rk;
  uchar mask_prepending;
  int k;
  int k_1;
  uchar mask_rc;
  int r;
  int c;
  int n_local;
  uchar *L_local;
  
  for (c = 1; r = c, c <= n + -1; c = c + 1) {
    while (r = r + 1, r <= n + -1) {
      bVar2 = 7U - (char)(c % 8) & 0x1f;
      bVar2 = (char)(0 >> bVar2) - ((byte)((int)(uint)L[(r * n) / 8 + c / 8] >> bVar2) & 1);
      for (k_1 = 0; k_1 <= c + -9; k_1 = k_1 + 8) {
        iVar4 = r * (n / 8) + k_1 / 8;
        L[iVar4] = L[iVar4] ^ bVar2 & L[c * (n / 8) + k_1 / 8];
      }
      iVar4 = c + -1;
      bVar3 = (char)(0x80 >> ((byte)((long)iVar4 % 8) & 0x1f)) - 1;
      bVar1 = L[r * (n / 8) + iVar4 / 8];
      iVar5 = r * (n / 8) + iVar4 / 8;
      L[iVar5] = L[iVar5] ^ bVar2 & L[c * (n / 8) + iVar4 / 8];
      iVar5 = r * (n / 8) + iVar4 / 8;
      L[iVar5] = L[iVar5] & (bVar3 ^ 0xff);
      iVar4 = r * (n / 8) + iVar4 / 8;
      L[iVar4] = L[iVar4] | bVar1 & bVar3;
    }
  }
  return;
}

Assistant:

void invert_L8(unsigned char *L, int n)
{
  /*
   * inversion == forward substitution
   *
   * For all columns c = 1 ... n-1
   *   For all rows c+1 ... n-1
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = 0 ... c-1
   */

  for(int c = 1; c <= n-1; c++)
  {
    /*
     * Basically:
     *      copy elements 0 to c-1  from c'th row to r'th row iff leading element of row r is 1
     */
    for(int r = c+1; r <= n-1; r++)
    {
      /*
       * first copy all "full bytes" at the left
       */
      unsigned char mask_rc = 0x00 - ((L[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = 0; k <= c-1 - 8; k += 8)
      {
        L[r*(n/8) + k/8] ^= mask_rc & L[c*(n/8) + k/8];
      }

      /*
       * then handle the right-most "partial byte"
       */
      int k = c-1;
      unsigned char mask_prepending = ((unsigned char) (0x80 >> (k % 8)) - 1);

      unsigned char tmp_rk = L[r*(n/8) + k/8] & mask_prepending; // store the right side of the splitted byte in tmp
      L[r*(n/8) + k/8]  ^= (mask_rc & L[c*(n/8) + k/8]);

      // restore the right bits: first set bits 0, then 'or' tmp
      L[r*(n/8) + k/8] &= ~mask_prepending;
      L[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}